

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O3

bool __thiscall amrex::StreamRetry::TryOutput(StreamRetry *this)

{
  ostringstream *poVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  double dVar7;
  Print local_1b0;
  
  iVar5 = this->tries;
  if (iVar5 == 0) {
    this->tries = 1;
LAB_00520236:
    bVar6 = true;
  }
  else {
    if (((byte)this->sros[*(long *)(*(long *)this->sros + -0x18) + 0x20] & 5) != 0) {
      nStreamErrors = nStreamErrors + 1;
      iVar2 = *(int *)(ParallelContext::frames + 0xc);
      iVar3 = this->maxTries;
      iVar4 = Verbose();
      if (iVar5 <= iVar3) {
        if (1 < iVar4) {
          local_1b0.os = OutStream();
          poVar1 = &local_1b0.ss;
          local_1b0.rank = -1;
          local_1b0.comm = *(MPI_Comm *)(DAT_00816950 + -0x48);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
          *(undefined8 *)(&local_1b0.field_0x18 + *(long *)(local_1b0._16_8_ + -0x18)) =
               *(undefined8 *)(local_1b0.os + *(long *)(*(long *)local_1b0.os + -0x18) + 8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"PROC: ",6);
          std::ostream::operator<<(poVar1,iVar2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1," :: STREAMRETRY_",0x10);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,(this->suffix)._M_dataplus._M_p,
                     (this->suffix)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," # ",3);
          std::ostream::operator<<(poVar1,this->tries);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," :: gbfe:  ",0xb);
          bVar6 = SUB81(poVar1,0);
          std::ostream::_M_insert<bool>(bVar6);
          std::ostream::_M_insert<bool>(bVar6);
          std::ostream::_M_insert<bool>(bVar6);
          std::ostream::_M_insert<bool>(bVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," :: sec = ",10);
          dVar7 = ParallelDescriptor::second();
          std::ostream::_M_insert<double>(dVar7);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1," :: os.tellp() = ",0x11);
          std::ostream::tellp();
          std::ostream::_M_insert<long>((long)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1," :: rewind spos = ",0x12);
          std::ostream::_M_insert<long>((long)poVar1);
          std::ios::widen((char)*(undefined8 *)(local_1b0._16_8_ + -0x18) + bVar6);
          std::ostream::put(bVar6);
          std::ostream::flush();
          Print::~Print(&local_1b0);
        }
        std::ios::clear((int)this->sros + (int)*(undefined8 *)(*(long *)this->sros + -0x18));
        iVar5 = Verbose();
        if (1 < iVar5) {
          local_1b0.os = OutStream();
          poVar1 = &local_1b0.ss;
          local_1b0.rank = -1;
          local_1b0.comm = *(MPI_Comm *)(DAT_00816950 + -0x48);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
          *(undefined8 *)(&local_1b0.field_0x18 + *(long *)(local_1b0._16_8_ + -0x18)) =
               *(undefined8 *)(local_1b0.os + *(long *)(*(long *)local_1b0.os + -0x18) + 8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"After os.clear() : gbfe:  ",0x1a);
          bVar6 = SUB81(poVar1,0);
          std::ostream::_M_insert<bool>(bVar6);
          std::ostream::_M_insert<bool>(bVar6);
          std::ostream::_M_insert<bool>(bVar6);
          std::ostream::_M_insert<bool>(bVar6);
          std::ios::widen((char)*(undefined8 *)(local_1b0._16_8_ + -0x18) + bVar6);
          std::ostream::put(bVar6);
          std::ostream::flush();
          Print::~Print(&local_1b0);
        }
        std::ostream::seekp((long)this->sros,(_Ios_Seekdir)(this->spos)._M_off);
        this->tries = this->tries + 1;
        goto LAB_00520236;
      }
      if (1 < iVar4) {
        local_1b0.os = OutStream();
        poVar1 = &local_1b0.ss;
        local_1b0.rank = -1;
        local_1b0.comm = *(MPI_Comm *)(DAT_00816950 + -0x48);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        *(undefined8 *)(&local_1b0.field_0x18 + *(long *)(local_1b0._16_8_ + -0x18)) =
             *(undefined8 *)(local_1b0.os + *(long *)(*(long *)local_1b0.os + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"PROC: ",6);
        std::ostream::operator<<(poVar1,iVar2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1," :: STREAMFAILED_",0x11);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,(this->suffix)._M_dataplus._M_p,(this->suffix)._M_string_length
                  );
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," # ",3);
        std::ostream::operator<<(poVar1,this->tries);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1," :: File may be corrupt.  :: gbfe:  ",0x24);
        bVar6 = SUB81(poVar1,0);
        std::ostream::_M_insert<bool>(bVar6);
        std::ostream::_M_insert<bool>(bVar6);
        std::ostream::_M_insert<bool>(bVar6);
        std::ostream::_M_insert<bool>(bVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," :: sec = ",10);
        dVar7 = ParallelDescriptor::second();
        std::ostream::_M_insert<double>(dVar7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1," :: os.tellp() = ",0x11);
        std::ostream::tellp();
        std::ostream::_M_insert<long>((long)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1," :: rewind spos = ",0x12);
        std::ostream::_M_insert<long>((long)poVar1);
        std::ios::widen((char)*(undefined8 *)(local_1b0._16_8_ + -0x18) + bVar6);
        std::ostream::put(bVar6);
        std::ostream::flush();
        Print::~Print(&local_1b0);
      }
      std::ios::clear((int)this->sros + (int)*(undefined8 *)(*(long *)this->sros + -0x18));
      iVar5 = Verbose();
      if (iVar5 < 2) {
        return false;
      }
      local_1b0.os = OutStream();
      poVar1 = &local_1b0.ss;
      local_1b0.rank = -1;
      local_1b0.comm = *(MPI_Comm *)(DAT_00816950 + -0x48);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      *(undefined8 *)(&local_1b0.field_0x18 + *(long *)(local_1b0._16_8_ + -0x18)) =
           *(undefined8 *)(local_1b0.os + *(long *)(*(long *)local_1b0.os + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"After os.clear() : gbfe:  ",0x1a);
      bVar6 = SUB81(poVar1,0);
      std::ostream::_M_insert<bool>(bVar6);
      std::ostream::_M_insert<bool>(bVar6);
      std::ostream::_M_insert<bool>(bVar6);
      std::ostream::_M_insert<bool>(bVar6);
      std::ios::widen((char)*(undefined8 *)(local_1b0._16_8_ + -0x18) + bVar6);
      std::ostream::put(bVar6);
      std::ostream::flush();
      Print::~Print(&local_1b0);
    }
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool amrex::StreamRetry::TryOutput()
{
  if(tries == 0) {
    ++tries;
    return true;
  } else {
    if(sros.fail()) {
      ++nStreamErrors;
      int myProc(ParallelDescriptor::MyProc());
      if(tries <= maxTries) {
          if (amrex::Verbose() > 1) {
              amrex::AllPrint() << "PROC: " << myProc << " :: STREAMRETRY_" << suffix << " # "
                                << tries << " :: gbfe:  "
                                << sros.good() << sros.bad() << sros.fail() << sros.eof()
                                << " :: sec = " << ParallelDescriptor::second()
                                << " :: os.tellp() = " << sros.tellp()
                                << " :: rewind spos = " << spos
                                << std::endl;
          }
        sros.clear();  // clear the bad bits
        if (amrex::Verbose() > 1) {
            amrex::AllPrint() << "After os.clear() : gbfe:  " << sros.good() << sros.bad()
                              << sros.fail() << sros.eof() << std::endl;
        }
        sros.seekp(spos, std::ios::beg);  // reset stream position
        ++tries;
        return true;
      } else {
        if (amrex::Verbose() > 1) {
            amrex::AllPrint() << "PROC: " << myProc << " :: STREAMFAILED_" << suffix << " # "
                              << tries << " :: File may be corrupt.  :: gbfe:  "
                              << sros.good() << sros.bad() << sros.fail() << sros.eof()
                              << " :: sec = " << ParallelDescriptor::second()
                              << " :: os.tellp() = " << sros.tellp()
                              << " :: rewind spos = " << spos
                              << std::endl;
        }
        sros.clear();  // clear the bad bits
        if (amrex::Verbose() > 1) {
            amrex::AllPrint() << "After os.clear() : gbfe:  " << sros.good() << sros.bad()
                              << sros.fail() << sros.eof() << std::endl;
        }
        return false;
      }
    } else {
      return false;
    }
  }
}